

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1900.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  timeval tVar7;
  timeval tVar8;
  timeval older;
  int ec_7;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int found;
  int i;
  __time_t local_248;
  __suseconds_t local_240;
  long local_238;
  long timeout;
  undefined1 local_228 [4];
  int maxfd;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  timeval now;
  timeval interval;
  __suseconds_t local_80;
  CURLMcode ec_6;
  CURLMcode ec_5;
  CURLMcode ec_4;
  CURLMcode ec_3;
  CURLMcode ec_2;
  CURLMcode ec_1;
  CURLMcode ec;
  __suseconds_t local_50;
  __time_t local_48;
  timeval last_handle_add;
  int local_30;
  int handlenum;
  int running;
  int msgs_left;
  CURLMsg *msg;
  CURLM *m;
  char *pcStack_10;
  int res;
  char *URL_local;
  
  m._4_4_ = 0;
  msg = (CURLMsg *)0x0;
  local_30 = 0;
  last_handle_add.tv_usec._4_4_ = 0;
  pcStack_10 = URL;
  iVar2 = parse_url_file(libtest_arg2);
  if (0 < iVar2) {
    tVar7 = tutil_tvnow();
    _ec_1 = tVar7.tv_sec;
    tv_test_start.tv_sec = _ec_1;
    local_50 = tVar7.tv_usec;
    tv_test_start.tv_usec = local_50;
    curl_global_init(3);
    msg = (CURLMsg *)curl_multi_init();
    if (msg == (CURLMsg *)0x0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1900.c"
                    ,0x98);
      m._4_4_ = 0x7b;
    }
    if (m._4_4_ == 0) {
      create_handles();
      iVar2 = curl_multi_setopt(msg,3,1);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_multi_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1900.c"
                      ,0x9c,iVar2,uVar3);
        m._4_4_ = iVar2;
      }
      if (m._4_4_ == 0) {
        iVar2 = curl_multi_setopt(msg,7,2);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_multi_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1900.c"
                        ,0x9d,iVar2,uVar3);
          m._4_4_ = iVar2;
        }
        if (m._4_4_ == 0) {
          iVar2 = curl_multi_setopt(msg,8,3);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_multi_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1900.c"
                          ,0x9e,iVar2,uVar3);
            m._4_4_ = iVar2;
          }
          if (m._4_4_ == 0) {
            iVar2 = curl_multi_setopt(msg,0x7539,15000);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1900.c"
                            ,0x9f,iVar2,uVar3);
              m._4_4_ = iVar2;
            }
            if (m._4_4_ == 0) {
              iVar2 = curl_multi_setopt(msg,0x753a,10000);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar3 = curl_multi_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1900.c"
                              ,0xa0,iVar2,uVar3);
                m._4_4_ = iVar2;
              }
              if (m._4_4_ == 0) {
                iVar2 = curl_multi_setopt(msg,0x271b,site_blacklist);
                uVar1 = _stderr;
                if (iVar2 != 0) {
                  uVar3 = curl_multi_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1900.c"
                                ,0xa2,iVar2,uVar3);
                  m._4_4_ = iVar2;
                }
                if (m._4_4_ == 0) {
                  iVar2 = curl_multi_setopt(msg,0x271c,server_blacklist);
                  uVar1 = _stderr;
                  if (iVar2 != 0) {
                    uVar3 = curl_multi_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1900.c"
                                  ,0xa3,iVar2,uVar3);
                    m._4_4_ = iVar2;
                  }
                  if (m._4_4_ == 0) {
                    tVar7 = tutil_tvnow();
                    interval.tv_usec = tVar7.tv_sec;
                    local_48 = interval.tv_usec;
                    local_80 = tVar7.tv_usec;
                    last_handle_add.tv_sec = local_80;
                    do {
                      timeout._4_4_ = -99;
                      now.tv_usec = 1;
                      if (last_handle_add.tv_usec._4_4_ < num_handles) {
                        tVar8 = tutil_tvnow();
                        local_248 = tVar8.tv_sec;
                        local_240 = tVar8.tv_usec;
                        now.tv_sec = local_240;
                        tVar7.tv_usec = last_handle_add.tv_sec;
                        tVar7.tv_sec = local_48;
                        lVar4 = tutil_tvdiff(tVar8,tVar7);
                        if (urltime[last_handle_add.tv_usec._4_4_] <= lVar4) {
                          curl_mfprintf(_stdout,"Adding handle %d\n",last_handle_add.tv_usec._4_4_);
                          setup_handle(pcStack_10,(CURLM *)msg,last_handle_add.tv_usec._4_4_);
                          local_48 = local_248;
                          last_handle_add.tv_sec = now.tv_sec;
                          last_handle_add.tv_usec._4_4_ = last_handle_add.tv_usec._4_4_ + 1;
                        }
                      }
                      curl_multi_perform(msg,&local_30);
                      tVar7 = tutil_tvnow();
                      tVar8.tv_usec = tv_test_start.tv_usec;
                      tVar8.tv_sec = tv_test_start.tv_sec;
                      lVar4 = tutil_tvdiff(tVar7,tVar8);
                      if (60000 < lVar4) {
                        curl_mfprintf(_stderr,
                                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1900.c"
                                      ,0xbd);
                        m._4_4_ = 0x7d;
                      }
                      if (m._4_4_ != 0) break;
                      do {
                        _running = (int *)curl_multi_info_read(msg,&handlenum);
                        if ((_running != (int *)0x0) && (*_running == 1)) {
                          for (__i = 0; ((int)__i < num_handles &&
                                        (*(CURL **)(_running + 2) != handles[(int)__i]));
                              __i = __i + 1) {
                          }
                          curl_mprintf("Handle %d Completed with status %d\n",__i,_running[4]);
                          curl_multi_remove_handle(msg,handles[(int)__i]);
                        }
                      } while (_running != (int *)0x0);
                      if ((last_handle_add.tv_usec._4_4_ == num_handles) && (local_30 == 0)) break;
                      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
                        wr.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
                      }
                      for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10;
                          __arr_1._4_4_ = __arr_1._4_4_ + 1) {
                        exc.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
                      }
                      for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10;
                          __arr_2._4_4_ = __arr_2._4_4_ + 1) {
                        *(undefined8 *)(local_228 + (ulong)__arr_2._4_4_ * 8) = 0;
                      }
                      curl_multi_fdset(msg,wr.__fds_bits + 0xf,exc.__fds_bits + 0xf,local_228,
                                       (long)&timeout + 4);
                      curl_multi_timeout(msg,&local_238);
                      if (local_238 < 0) {
                        local_238 = 1;
                      }
                      now.tv_usec = 0;
                      iVar2 = select_wrapper(timeout._4_4_ + 1,(fd_set *)(wr.__fds_bits + 0xf),
                                             (fd_set *)(exc.__fds_bits + 0xf),(fd_set *)local_228,
                                             (timeval *)&now.tv_usec);
                      if (iVar2 == -1) {
                        piVar5 = __errno_location();
                        uVar1 = _stderr;
                        iVar2 = *piVar5;
                        pcVar6 = strerror(iVar2);
                        curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1900.c"
                                      ,0xe8,iVar2,pcVar6);
                        m._4_4_ = 0x79;
                      }
                      if (m._4_4_ != 0) break;
                      tVar7 = tutil_tvnow();
                      older.tv_usec = tv_test_start.tv_usec;
                      older.tv_sec = tv_test_start.tv_sec;
                      lVar4 = tutil_tvdiff(tVar7,older);
                      if (60000 < lVar4) {
                        curl_mfprintf(_stderr,
                                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1900.c"
                                      ,0xea);
                        m._4_4_ = 0x7d;
                      }
                    } while (m._4_4_ == 0);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  remove_handles();
  curl_multi_cleanup(msg);
  curl_global_cleanup();
  free_urls();
  return m._4_4_;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURLM *m = NULL;
  CURLMsg *msg; /* for picking up messages with the transfer status */
  int msgs_left; /* how many messages are left */
  int running = 0;
  int handlenum = 0;
  struct timeval last_handle_add;

  if(parse_url_file(libtest_arg2) <= 0)
    goto test_cleanup;

  start_test_timing();

  curl_global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  create_handles();

  multi_setopt(m, CURLMOPT_PIPELINING, 1L);
  multi_setopt(m, CURLMOPT_MAX_HOST_CONNECTIONS, 2L);
  multi_setopt(m, CURLMOPT_MAX_PIPELINE_LENGTH, 3L);
  multi_setopt(m, CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE, 15000L);
  multi_setopt(m, CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE, 10000L);

  multi_setopt(m, CURLMOPT_PIPELINING_SITE_BL, site_blacklist);
  multi_setopt(m, CURLMOPT_PIPELINING_SERVER_BL, server_blacklist);

  last_handle_add = tutil_tvnow();

  for(;;) {
    struct timeval interval;
    struct timeval now;
    fd_set rd, wr, exc;
    int maxfd = -99;
    long timeout;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    if(handlenum < num_handles) {
      now = tutil_tvnow();
      if(tutil_tvdiff(now, last_handle_add) >= urltime[handlenum]) {
        fprintf(stdout, "Adding handle %d\n", handlenum);
        setup_handle(URL, m, handlenum);
        last_handle_add = now;
        handlenum++;
      }
    }

    curl_multi_perform(m, &running);

    abort_on_test_timeout();

    /* See how the transfers went */
    do {
      msg = curl_multi_info_read(m, &msgs_left);
      if(msg && msg->msg == CURLMSG_DONE) {
        int i;

        /* Find out which handle this message is about */
        for(i = 0; i < num_handles; i++) {
          int found = (msg->easy_handle == handles[i]);
          if(found)
            break;
        }

        printf("Handle %d Completed with status %d\n", i, msg->data.result);
        curl_multi_remove_handle(m, handles[i]);
      }
    } while(msg);

    if(handlenum == num_handles && !running) {
      break; /* done */
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    curl_multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    curl_multi_timeout(m, &timeout);

    if(timeout < 0)
      timeout = 1;

    interval.tv_sec = timeout / 1000;
    interval.tv_usec = (timeout % 1000) * 1000;

    interval.tv_sec = 0;
    interval.tv_usec = 1000;

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  remove_handles();

  /* undocumented cleanup sequence - type UB */

  curl_multi_cleanup(m);
  curl_global_cleanup();

  free_urls();
  return res;
}